

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

bool __thiscall slang::SourceManager::isMacroArgLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  ulong uVar2;
  undefined1 uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)location & 0xfffffff;
  uVar3 = 0;
  if ((uVar4 != 0) && (uVar3 = 0, location != (SourceLocation)0xffffffffffffffff)) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            0x6db6db6db6db6db7;
    if (uVar2 < uVar4 || uVar2 - uVar4 == 0) {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0xa3,"bool slang::SourceManager::isMacroArgLoc(SourceLocation) const");
    }
    uVar3 = 0;
    if ((pvVar1 != (pointer)0x0) &&
       (uVar3 = 0,
       *(__index_type *)
        ((long)&pvVar1[uVar4].
                super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
        + 0x30) == '\x01')) {
      uVar3 = *(undefined1 *)
               ((long)&pvVar1[uVar4].
                       super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               + 0x18);
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return (bool)uVar3;
}

Assistant:

bool SourceManager::isMacroArgLoc(SourceLocation location) const {
    if (location == SourceLocation::NoLocation)
        return false;

    auto buffer = location.buffer();
    if (!buffer)
        return false;

    std::shared_lock lock(mut);

    ASSERT(buffer.getId() < bufferEntries.size());
    auto info = std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]);
    return info && info->isMacroArg;
}